

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightlist.h
# Opt level: O2

void __thiscall
Common::lightlist<ICM::Object*>::lightlist<ICM::Object*const*>
          (lightlist<ICM::Object*> *this,Object **begin,Object **end)

{
  lightlist<ICM::Object_*>::lightlist((lightlist<ICM::Object_*> *)this,(long)end - (long)begin >> 3)
  ;
  if ((long)end - (long)begin != 0) {
    memmove(*(void **)(this + 8),begin,(long)end - (long)begin);
    return;
  }
  return;
}

Assistant:

lightlist(Iter begin, Iter end)
		: lightlist(static_cast<size_t>(end - begin)) {
		std::copy(begin, end, _PointerIterator(_data.get()));
	}